

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingBufferDescriptor.h
# Opt level: O0

void aeron::concurrent::ringbuffer::RingBufferDescriptor::checkCapacity(index_t capacity)

{
  bool bVar1;
  IllegalArgumentException *this;
  char *pcVar2;
  int in_EDI;
  allocator *filename;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  int local_4;
  
  local_4 = in_EDI;
  bVar1 = util::BitUtil::isPowerOfTwo<int>(in_EDI);
  if (!bVar1) {
    this = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_48,local_4);
    std::operator+(&local_28,"Capacity must be a positive power of 2 + TRAILER_LENGTH: capacity=",
                   &local_48);
    filename = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,
               "void aeron::concurrent::ringbuffer::RingBufferDescriptor::checkCapacity(util::index_t)"
               ,filename);
    pcVar2 = util::past_prefix((char *)this,(char *)filename);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,pcVar2,&local_a1);
    util::IllegalArgumentException::IllegalArgumentException
              (this,&local_28,&local_78,&local_a0,0x32);
    __cxa_throw(this,&util::IllegalArgumentException::typeinfo,
                util::IllegalArgumentException::~IllegalArgumentException);
  }
  return;
}

Assistant:

inline static void checkCapacity(util::index_t capacity)
    {
        if (!util::BitUtil::isPowerOfTwo(capacity))
        {
            throw util::IllegalArgumentException(
                "Capacity must be a positive power of 2 + TRAILER_LENGTH: capacity=" + std::to_string(capacity),
                SOURCEINFO);
        }
    }